

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Result __thiscall
testing::internal::FunctionMocker<void_()>::PerformDefaultAction
          (FunctionMocker<void_()> *this,ArgumentTuple *args,string *call_description)

{
  OnCallSpec<void_()> *this_00;
  Action<void_()> *pAVar1;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this_00 = FindOnCallSpec(this,args);
  if (this_00 != (OnCallSpec<void_()> *)0x0) {
    pAVar1 = OnCallSpec<void_()>::GetAction(this_00);
    Action<void_()>::Perform(pAVar1);
    return;
  }
  std::operator+(&local_30,call_description,
                 "\n    The mock function has no default action set, and its return type has no default value set."
                );
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec = this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }